

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

Node * __thiscall Fl_Preferences::Node::search(Node *this,char *path,int offset)

{
  char *pcVar1;
  int iVar2;
  Node *pNVar3;
  size_t sVar4;
  Node *pNVar5;
  uint uVar6;
  ulong __n;
  
  while( true ) {
    if (offset != 0) goto LAB_001c4ba1;
    if (*path != '.') break;
    pNVar3 = this;
    if (path[1] != '/') {
      if (path[1] == '\0') {
        return this;
      }
      break;
    }
    do {
      this = pNVar3;
      if ((this->field_0x30 & 2) == 0) {
        pNVar3 = (this->field_2).parent_;
      }
      else {
        pNVar3 = (Node *)0x0;
      }
    } while (pNVar3 != (Node *)0x0);
    pcVar1 = path + 2;
    path = path + 2;
    offset = 2;
    if (*pcVar1 == '\0') {
      return this;
    }
  }
  sVar4 = strlen(this->path_);
  offset = (int)sVar4 + 1;
LAB_001c4ba1:
  pcVar1 = this->path_;
  sVar4 = strlen(pcVar1);
  iVar2 = (int)sVar4;
  if (offset + -1 <= iVar2) {
    uVar6 = iVar2 - offset;
    __n = (ulong)uVar6;
    if ((uVar6 == 0 || iVar2 < offset) || (iVar2 = strncmp(path,pcVar1 + offset,__n), iVar2 == 0)) {
      if ((0 < (int)uVar6) && (path[__n] == '\0')) {
        return this;
      }
      if ((int)uVar6 < 1) {
        pNVar3 = this->child_;
        goto joined_r0x001c4c06;
      }
      if (path[__n] == '/') {
        pNVar3 = this->child_;
        if (pNVar3 == (Node *)0x0) {
          return (Node *)0x0;
        }
        do {
          pNVar5 = search(pNVar3,path,offset);
          if (pNVar5 != (Node *)0x0) {
            return pNVar5;
          }
          pNVar3 = pNVar3->next_;
joined_r0x001c4c06:
        } while (pNVar3 != (Node *)0x0);
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::search( const char *path, int offset ) { 
  if ( offset == 0 ) {
    if ( path[0] == '.' ) {
      if ( path[1] == 0 ) {
	return this; // user was searching for current node
      } else if ( path[1] == '/' ) {
	Node *nn = this;
	while ( nn->parent() ) nn = nn->parent();
	if ( path[2]==0 ) {		// user is searching for root ( "./" )
	  return nn;
	}
	return nn->search( path+2, 2 ); // do a relative search on the root node
      }
    }
    offset = (int) strlen( path_ ) + 1;
  }
  int len = (int) strlen( path_ );
  if ( len < offset-1 ) return 0;
  len -= offset;
  if ( ( len <= 0 ) || ( strncmp( path, path_+offset, len ) == 0 ) ) {
    if ( len > 0 && path[ len ] == 0 )
      return this;
    if ( len <= 0 || path[ len ] == '/' ) {
      for ( Node *nd = child_; nd; nd = nd->next_ ) {
	Node *nn = nd->search( path, offset );
	if ( nn ) return nn;
      }
      return 0;
    }
  }
  return 0;
}